

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O0

void print_user_if_params_table(dlog_mt_user_if_params_t *user_if_table)

{
  dlog_mt_user_if_params_t *user_if_table_local;
  
  printf("\tDigit clear delay:           %5d\n",(ulong)user_if_table->digit_clear_delay);
  printf("\tTransient Delay:             %5d\n",(ulong)user_if_table->transient_delay);
  printf("\tTransient Hint Time:         %5d\n",(ulong)user_if_table->transient_hint_time);
  printf("\tVisual to Voice Delay:       %5d\n",(ulong)user_if_table->visual_to_voice_delay);
  printf("\tVoice Repetition Delay:      %5d\n",(ulong)user_if_table->voice_repitition_delay);
  printf("\tNo Action Timeout:           %5d\n",(ulong)user_if_table->no_action_timeout);
  printf("\tCard Validation Timeout:     %5d\n",(ulong)user_if_table->card_validation_timeout);
  printf("\tDJ 2nd String DTMF Timeout:  %5d\n",(ulong)user_if_table->dj_second_string_dtmf_timeout)
  ;
  printf("\tCP Input Timeout:            %5d\n",(ulong)user_if_table->cp_input_timeout);
  printf("\tLanguage Timeout:            %5d\n",(ulong)user_if_table->language_timeout);
  printf("\tCFS Timeout:                 %5d\n",(ulong)user_if_table->cfs_timeout);
  printf("\tCPD Timeout:                 %5d\n",(ulong)user_if_table->called_party_disconnect);
  printf("\t# Voice Prompt Repititions:     %2d\n",(ulong)user_if_table->no_voice_prompt_reps);
  printf("\tACCS Digit Timeout:          %5d\n",(ulong)user_if_table->accs_digit_timeout);
  printf("\tCollect Call Timeout:        %5d\n",(ulong)user_if_table->collect_call_timeout);
  printf("\tBong Tone Timeout:           %5d\n",(ulong)user_if_table->bong_tone_timeout);
  printf("\tACCS No Action Timeout:      %5d\n",(ulong)user_if_table->accs_no_action_timeout);
  printf("\tCCard Auth Required Timeout: %5d\n",(ulong)user_if_table->card_auth_required_timeout);
  printf("\tRate Request Timeout:        %5d\n",(ulong)user_if_table->rate_request_timeout);
  printf("\tManual Dial Hold Time:       %5d\n",(ulong)user_if_table->manual_dial_hold_time);
  printf("\tAutodialer Hold Time:        %5d\n",(ulong)user_if_table->autodialer_hold_time);
  printf("\tCoin First Warning Time:     %5d\n",(ulong)user_if_table->coin_first_warning_time);
  printf("\tCoin Second Warning Time:    %5d\n",(ulong)user_if_table->coin_second_warning_time);
  printf("\tAlt Bong Tone Timeout:       %5d\n",(ulong)user_if_table->alternate_bong_tone_timeout);
  printf("\tDelay After Bong Tone:       %5d\n",(ulong)user_if_table->delay_after_bong_tone);
  printf("\tAlt Delay After Bong Tone:   %5d\n",
         (ulong)user_if_table->alternate_delay_after_bong_tone);
  printf("\tDisplay Scroll Speed:        %5d\n",(ulong)user_if_table->display_scroll_speed);
  printf("\tAOS Bong Tone Timeout:       %5d\n",(ulong)user_if_table->aos_bong_tone_timeout);
  printf("\tFGB AOS Second Spill Timeout:%5d\n",(ulong)user_if_table->fgb_aos_second_spill_timeout);
  printf("\tDatajack Connect Timeout:    %5d\n",(ulong)user_if_table->datajack_connect_timeout);
  printf("\tDatajack Pause Threshold:    %5d\n",(ulong)user_if_table->datajack_pause_threshold);
  printf("\tDatajack IAS Timer:          %5d\n",(ulong)user_if_table->datajack_ias_timer);
  return;
}

Assistant:

void print_user_if_params_table(dlog_mt_user_if_params_t* user_if_table) {
    printf("\tDigit clear delay:           %5d\n", LE16(user_if_table->digit_clear_delay));
    printf("\tTransient Delay:             %5d\n", LE16(user_if_table->transient_delay));
    printf("\tTransient Hint Time:         %5d\n", LE16(user_if_table->transient_hint_time));
    printf("\tVisual to Voice Delay:       %5d\n", LE16(user_if_table->visual_to_voice_delay));
    printf("\tVoice Repetition Delay:      %5d\n", LE16(user_if_table->voice_repitition_delay));
    printf("\tNo Action Timeout:           %5d\n", LE16(user_if_table->no_action_timeout));
    printf("\tCard Validation Timeout:     %5d\n", LE16(user_if_table->card_validation_timeout));
    printf("\tDJ 2nd String DTMF Timeout:  %5d\n", LE16(user_if_table->dj_second_string_dtmf_timeout));
    printf("\tCP Input Timeout:            %5d\n", LE16(user_if_table->cp_input_timeout));
    printf("\tLanguage Timeout:            %5d\n", LE16(user_if_table->language_timeout));
    printf("\tCFS Timeout:                 %5d\n", LE16(user_if_table->cfs_timeout));
    printf("\tCPD Timeout:                 %5d\n", LE16(user_if_table->called_party_disconnect));
    printf("\t# Voice Prompt Repititions:     %2d\n", user_if_table->no_voice_prompt_reps);
    printf("\tACCS Digit Timeout:          %5d\n", LE16(user_if_table->accs_digit_timeout));
    printf("\tCollect Call Timeout:        %5d\n", LE16(user_if_table->collect_call_timeout));
    printf("\tBong Tone Timeout:           %5d\n", LE16(user_if_table->bong_tone_timeout));
    printf("\tACCS No Action Timeout:      %5d\n", LE16(user_if_table->accs_no_action_timeout));
    printf("\tCCard Auth Required Timeout: %5d\n", LE16(user_if_table->card_auth_required_timeout));
    printf("\tRate Request Timeout:        %5d\n", LE16(user_if_table->rate_request_timeout));
    printf("\tManual Dial Hold Time:       %5d\n", LE16(user_if_table->manual_dial_hold_time));
    printf("\tAutodialer Hold Time:        %5d\n", LE16(user_if_table->autodialer_hold_time));
    printf("\tCoin First Warning Time:     %5d\n", LE16(user_if_table->coin_first_warning_time));
    printf("\tCoin Second Warning Time:    %5d\n", LE16(user_if_table->coin_second_warning_time));
    printf("\tAlt Bong Tone Timeout:       %5d\n", LE16(user_if_table->alternate_bong_tone_timeout));
    printf("\tDelay After Bong Tone:       %5d\n", LE16(user_if_table->delay_after_bong_tone));
    printf("\tAlt Delay After Bong Tone:   %5d\n", LE16(user_if_table->alternate_delay_after_bong_tone));
    printf("\tDisplay Scroll Speed:        %5d\n", LE16(user_if_table->display_scroll_speed));
    printf("\tAOS Bong Tone Timeout:       %5d\n", LE16(user_if_table->aos_bong_tone_timeout));
    printf("\tFGB AOS Second Spill Timeout:%5d\n", LE16(user_if_table->fgb_aos_second_spill_timeout));
    printf("\tDatajack Connect Timeout:    %5d\n", LE16(user_if_table->datajack_connect_timeout));
    printf("\tDatajack Pause Threshold:    %5d\n", LE16(user_if_table->datajack_pause_threshold));
    printf("\tDatajack IAS Timer:          %5d\n", LE16(user_if_table->datajack_ias_timer));
}